

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> * __thiscall
libtorrent::session_handle::
sync_call_ret<libtorrent::settings_pack,libtorrent::settings_pack(libtorrent::aux::session_impl::*)()const>
          (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
           *__return_storage_ptr__,session_handle *this,offset_in_session_impl_to_subr f)

{
  bool bVar1;
  element_type *peVar2;
  io_context *ctx;
  undefined1 auVar3 [12];
  undefined1 local_a8 [8];
  type_conflict1 local_a0;
  exception_ptr local_68;
  exception_ptr ex;
  bool done;
  error_code_enum local_4c;
  undefined1 local_48 [8];
  shared_ptr<libtorrent::aux::session_impl> s;
  offset_in_session_impl_to_subr f_local;
  session_handle *this_local;
  vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *r;
  
  s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)f;
  ::std::weak_ptr<libtorrent::aux::session_impl>::lock
            ((weak_ptr<libtorrent::aux::session_impl> *)local_48);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
  if (!bVar1) {
    local_4c = invalid_session_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_4c);
  }
  ex._M_exception_object._3_1_ = 0;
  ex._M_exception_object._2_1_ = 0;
  settings_pack::settings_pack((settings_pack *)__return_storage_ptr__);
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_68);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
  ctx = libtorrent::aux::session_impl::get_context(peVar2);
  local_a0.done = (bool *)((long)&ex._M_exception_object + 3);
  local_a0.r = __return_storage_ptr__;
  local_a0.ex = &local_68;
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr
            (&local_a0.s,(shared_ptr<libtorrent::aux::session_impl> *)local_48);
  local_a0.f = (offset_in_session_impl_to_subr)
               s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call_ret<libtorrent::settings_pack,libtorrent::settings_pack(libtorrent::aux::session_impl::*)()const>(libtorrent::settings_pack(libtorrent::aux::session_impl::*)()const)const::_lambda()_1_>
            (ctx,&local_a0,(type *)0x0);
  const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)&local_a0);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_48);
  libtorrent::aux::torrent_wait((bool *)((long)&ex._M_exception_object + 3),peVar2);
  bVar1 = ::std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    ex._M_exception_object._2_1_ = 1;
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_68);
    if ((ex._M_exception_object._2_1_ & 1) == 0) {
      settings_pack::~settings_pack((settings_pack *)__return_storage_ptr__);
    }
    ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
              ((shared_ptr<libtorrent::aux::session_impl> *)local_48);
    return __return_storage_ptr__;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_a8,&local_68);
  auVar3 = ::std::rethrow_exception((exception_ptr)local_a8);
  ex._M_exception_object._4_4_ = auVar3._8_4_;
  const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)&local_a0);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_68);
  settings_pack::~settings_pack((settings_pack *)__return_storage_ptr__);
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_48);
  _Unwind_Resume(auVar3._0_8_);
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}